

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O1

CompilationOptions * __thiscall slang::Bag::insertOrGet<slang::ast::CompilationOptions>(Bag *this)

{
  long lVar1;
  group_type_pointer pgVar2;
  pointer_____offset_0x10___ __s1;
  pointer_____offset_0x10___ __s2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  size_t sVar6;
  CompilationOptions *pCVar7;
  uint uVar8;
  value_type_pointer ppVar9;
  value_type_pointer ppVar10;
  group_type_pointer pgVar11;
  type_index tVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  locator res;
  try_emplace_args_t local_b1;
  type_index local_b0;
  ulong local_a8;
  ulong local_a0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
  *local_98;
  ulong local_90;
  ulong local_88;
  size_t local_80;
  ulong local_78;
  type_info *local_70;
  value_type_pointer local_68;
  group_type_pointer local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  locator local_48;
  
  local_b0._M_target = (type_info *)&ast::CompilationOptions::typeinfo;
  sVar6 = std::type_info::hash_code((type_info *)&ast::CompilationOptions::typeinfo);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar6;
  uVar15 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar14 = uVar15 >> ((byte)(this->items).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar11 = (this->items).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
            .arrays.groups_;
  lVar1 = (uVar15 & 0xff) * 4;
  uVar22 = (&UNK_0047c76c)[lVar1];
  uVar23 = (&UNK_0047c76d)[lVar1];
  uVar24 = (&UNK_0047c76e)[lVar1];
  uVar25 = (&UNK_0047c76f)[lVar1];
  uVar13 = (ulong)((uint)uVar15 & 7);
  sVar6 = (this->items).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
          .arrays.groups_size_mask;
  uVar17 = 0;
  ppVar9 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.elements_;
  tVar12._M_target = local_b0._M_target;
  uVar19 = uVar14;
  uVar26 = uVar22;
  uVar27 = uVar23;
  uVar28 = uVar24;
  uVar29 = uVar25;
  uVar30 = uVar22;
  uVar31 = uVar23;
  uVar32 = uVar24;
  uVar33 = uVar25;
  uVar34 = uVar22;
  uVar35 = uVar23;
  uVar36 = uVar24;
  uVar37 = uVar25;
  do {
    pgVar2 = pgVar11 + uVar19;
    auVar21[0] = -(pgVar2->m[0].n == uVar22);
    auVar21[1] = -(pgVar2->m[1].n == uVar23);
    auVar21[2] = -(pgVar2->m[2].n == uVar24);
    auVar21[3] = -(pgVar2->m[3].n == uVar25);
    auVar21[4] = -(pgVar2->m[4].n == uVar26);
    auVar21[5] = -(pgVar2->m[5].n == uVar27);
    auVar21[6] = -(pgVar2->m[6].n == uVar28);
    auVar21[7] = -(pgVar2->m[7].n == uVar29);
    auVar21[8] = -(pgVar2->m[8].n == uVar30);
    auVar21[9] = -(pgVar2->m[9].n == uVar31);
    auVar21[10] = -(pgVar2->m[10].n == uVar32);
    auVar21[0xb] = -(pgVar2->m[0xb].n == uVar33);
    auVar21[0xc] = -(pgVar2->m[0xc].n == uVar34);
    auVar21[0xd] = -(pgVar2->m[0xd].n == uVar35);
    auVar21[0xe] = -(pgVar2->m[0xe].n == uVar36);
    auVar21[0xf] = -(pgVar2->m[0xf].n == uVar37);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
    ppVar10 = ppVar9;
    uVar16 = uVar17;
    uVar18 = uVar19;
    if (uVar8 != 0) {
      __s1 = *(pointer_____offset_0x10___ *)(tVar12._M_target + 8);
      local_a8 = uVar14;
      local_a0 = uVar15;
      local_98 = (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                  *)this;
      local_90 = uVar19;
      local_88 = uVar17;
      local_80 = sVar6;
      local_78 = uVar13;
      local_70 = tVar12._M_target;
      local_68 = ppVar9;
      local_60 = pgVar11;
      local_58 = uVar22;
      uStack_57 = uVar23;
      uStack_56 = uVar24;
      uStack_55 = uVar25;
      uStack_54 = uVar26;
      uStack_53 = uVar27;
      uStack_52 = uVar28;
      uStack_51 = uVar29;
      uStack_50 = uVar30;
      uStack_4f = uVar31;
      uStack_4e = uVar32;
      uStack_4d = uVar33;
      uStack_4c = uVar34;
      uStack_4b = uVar35;
      uStack_4a = uVar36;
      uStack_49 = uVar37;
      do {
        uVar3 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        __s2 = *(pointer_____offset_0x10___ *)
                (ppVar9[uVar19 * 0xf + (ulong)uVar3].first._M_target + 8);
        if (__s1 == __s2) {
          bVar20 = true;
        }
        else if (*__s1 == '*') {
          bVar20 = false;
        }
        else {
          iVar5 = strcmp(__s1,__s2);
          bVar20 = iVar5 == 0;
          uVar22 = local_58;
          uVar23 = uStack_57;
          uVar24 = uStack_56;
          uVar25 = uStack_55;
          uVar26 = uStack_54;
          uVar27 = uStack_53;
          uVar28 = uStack_52;
          uVar29 = uStack_51;
          uVar30 = uStack_50;
          uVar31 = uStack_4f;
          uVar32 = uStack_4e;
          uVar33 = uStack_4d;
          uVar34 = uStack_4c;
          uVar35 = uStack_4b;
          uVar36 = uStack_4a;
          uVar37 = uStack_49;
        }
        uVar14 = local_a8;
        uVar15 = local_a0;
        this = (Bag *)local_98;
        if (bVar20) {
          ppVar9 = ppVar9 + uVar19 * 0xf + (ulong)uVar3;
          goto LAB_00149211;
        }
        uVar8 = uVar8 - 1 & uVar8;
        ppVar10 = local_68;
        pgVar11 = local_60;
        tVar12._M_target = local_70;
        uVar13 = local_78;
        sVar6 = local_80;
        uVar16 = local_88;
        uVar18 = local_90;
      } while (uVar8 != 0);
    }
    if ((pgVar11[uVar19].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar13]) == 0) break;
    uVar17 = uVar16 + 1;
    uVar19 = uVar18 + uVar16 + 1 & sVar6;
    ppVar9 = ppVar10;
  } while (uVar17 <= sVar6);
  ppVar9 = (value_type_pointer)0x0;
LAB_00149211:
  if (ppVar9 == (value_type_pointer)0x0) {
    if (*(ulong *)((long)this + 0x28) < *(ulong *)((long)this + 0x20)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                  *)this,(arrays_type *)this,uVar14,uVar15,&local_b1,&local_b0);
      *(long *)((long)this + 0x28) = *(long *)((long)this + 0x28) + 1;
      ppVar9 = local_48.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                  *)this,uVar15,&local_b1,&local_b0);
      ppVar9 = local_48.p;
    }
  }
  if ((ppVar9->second)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    std::any::
    __do_emplace<slang::ast::CompilationOptions,,std::any::_Manager_external<slang::ast::CompilationOptions>>
              (&ppVar9->second);
  }
  pCVar7 = (CompilationOptions *)std::__any_caster<slang::ast::CompilationOptions>(&ppVar9->second);
  return pCVar7;
}

Assistant:

T& insertOrGet() {
        auto& item = items[SLANG_TYPEOF(T)];
        if (!item.has_value())
            item.template emplace<T>();
        return *std::any_cast<T>(&item);
    }